

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

void __thiscall Game::Game(Game *this,size_t grid_width,size_t grid_height)

{
  mt19937 *this_00;
  uint uVar1;
  result_type rVar2;
  result_type rVar3;
  int iVar4;
  int iVar5;
  
  (this->snake).direction = kUp;
  (this->snake).speed = 0.1;
  (this->snake).size = 1;
  (this->snake).alive = true;
  (this->snake).body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->snake).body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->snake).body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->snake).body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  iVar5 = (int)grid_width;
  (this->snake).grid_width = iVar5;
  iVar4 = (int)grid_height;
  (this->snake).grid_height = iVar4;
  (this->snake2).direction = kUp;
  (this->snake2).speed = 0.1;
  (this->snake2).size = 1;
  (this->snake2).alive = true;
  (this->snake2).body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->snake2).body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->snake2).body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->snake2).body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->snake2).grid_width = iVar5;
  (this->snake2).grid_height = iVar4;
  std::random_device::random_device(&this->dev);
  uVar1 = std::random_device::_M_getval();
  this_00 = &this->engine;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(this_00,(ulong)uVar1);
  (this->random_w)._M_param._M_a = 0;
  (this->random_w)._M_param._M_b = iVar5;
  (this->random_h)._M_param._M_a = 0;
  (this->random_h)._M_param._M_b = iVar4;
  this->score = 0;
  rVar2 = std::uniform_int_distribution<int>::operator()(&this->random_w,this_00);
  rVar3 = std::uniform_int_distribution<int>::operator()(&this->random_h,this_00);
  (this->snake).head_x = (float)rVar2;
  (this->snake).head_y = (float)rVar3;
  rVar2 = std::uniform_int_distribution<int>::operator()(&this->random_w,this_00);
  rVar3 = std::uniform_int_distribution<int>::operator()(&this->random_h,this_00);
  (this->snake2).head_x = (float)rVar2;
  (this->snake2).head_y = (float)rVar3;
  PlaceFood(this);
  return;
}

Assistant:

Game::Game(std::size_t grid_width, std::size_t grid_height)
    : snake(grid_width, grid_height),
	  snake2(grid_width, grid_height),
      engine(dev()),
      random_w(0, static_cast<int>(grid_width)),
      random_h(0, static_cast<int>(grid_height)) 
{
  snake.setPosition(random_w(engine),random_h(engine));
  snake2.setPosition(random_w(engine),random_h(engine));
  PlaceFood();
}